

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsequentialanimationgroup.cpp
# Opt level: O2

QPauseAnimation * __thiscall
QSequentialAnimationGroup::insertPause(QSequentialAnimationGroup *this,int index,int msecs)

{
  QPauseAnimation *this_00;
  long in_FS_OFFSET;
  QMessageLogger local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if ((index < 0) || (*(ulong *)(*(long *)(this + 8) + 0xb0) < (ulong)(uint)index)) {
    local_48.context.version = 2;
    local_48.context.function._4_4_ = 0;
    local_48.context._4_8_ = 0;
    local_48.context._12_8_ = 0;
    local_48.context.category = "default";
    this_00 = (QPauseAnimation *)0x0;
    QMessageLogger::warning
              (&local_48,"QSequentialAnimationGroup::insertPause: index is out of bounds");
  }
  else {
    this_00 = (QPauseAnimation *)operator_new(0x10);
    QPauseAnimation::QPauseAnimation(this_00,msecs,(QObject *)0x0);
    QAnimationGroup::insertAnimation((QAnimationGroup *)this,index,(QAbstractAnimation *)this_00);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return (QPauseAnimation *)this_00;
  }
  __stack_chk_fail();
}

Assistant:

QPauseAnimation *QSequentialAnimationGroup::insertPause(int index, int msecs)
{
    Q_D(const QSequentialAnimationGroup);

    if (index < 0 || index > d->animations.size()) {
        qWarning("QSequentialAnimationGroup::insertPause: index is out of bounds");
        return nullptr;
    }

    QPauseAnimation *pause = new QPauseAnimation(msecs);
    insertAnimation(index, pause);
    return pause;
}